

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O0

Vec_Int_t * Pla_ManComputeDistance1(Pla_Man_t *p)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Int_t *p_00;
  abctime aVar4;
  Vec_Int_t *vPairs;
  abctime clk;
  Pla_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  p_00 = Pla_ManComputeDistance1Int(p);
  iVar1 = Vec_IntSize(p_00);
  uVar2 = Pla_ManCubeNum(p);
  printf("Found %d pairs among %d cubes using cube hashing.  ",(ulong)(uint)(iVar1 / 4),(ulong)uVar2
        );
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return p_00;
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vPairs = Pla_ManComputeDistance1Int( p );
    printf( "Found %d pairs among %d cubes using cube hashing.  ", Vec_IntSize(vPairs)/4, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vPairs;
}